

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint HuffmanTree_makeFromLengths2(HuffmanTree *tree)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  long *in_RDI;
  uint n;
  uint bits;
  uint error;
  uint *nextcode;
  uint *blcount;
  HuffmanTree *in_stack_00000058;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  local_1c = 0;
  pvVar2 = lodepng_malloc(0x356ef4);
  *in_RDI = (long)pvVar2;
  pvVar2 = lodepng_malloc(0x356f17);
  pvVar3 = lodepng_malloc(0x356f34);
  if (((*in_RDI == 0) || (pvVar2 == (void *)0x0)) || (pvVar3 == (void *)0x0)) {
    local_1c = 0x53;
  }
  if (local_1c == 0) {
    for (local_24 = 0; local_24 != (int)in_RDI[2] + 1U; local_24 = local_24 + 1) {
      *(undefined4 *)((long)pvVar3 + (ulong)local_24 * 4) = 0;
      *(undefined4 *)((long)pvVar2 + (ulong)local_24 * 4) = 0;
    }
    for (local_20 = 0; local_20 != *(uint *)((long)in_RDI + 0x14); local_20 = local_20 + 1) {
      uVar4 = (ulong)*(uint *)(in_RDI[1] + (ulong)local_20 * 4);
      *(int *)((long)pvVar2 + uVar4 * 4) = *(int *)((long)pvVar2 + uVar4 * 4) + 1;
    }
    for (local_20 = 1; local_20 <= *(uint *)(in_RDI + 2); local_20 = local_20 + 1) {
      *(int *)((long)pvVar3 + (ulong)local_20 * 4) =
           (*(int *)((long)pvVar3 + (ulong)(local_20 - 1) * 4) +
           *(int *)((long)pvVar2 + (ulong)(local_20 - 1) * 4)) * 2;
    }
    for (local_24 = 0; local_24 != *(uint *)((long)in_RDI + 0x14); local_24 = local_24 + 1) {
      if (*(int *)(in_RDI[1] + (ulong)local_24 * 4) != 0) {
        uVar4 = (ulong)*(uint *)(in_RDI[1] + (ulong)local_24 * 4);
        iVar1 = *(int *)((long)pvVar3 + uVar4 * 4);
        *(int *)((long)pvVar3 + uVar4 * 4) = iVar1 + 1;
        *(int *)(*in_RDI + (ulong)local_24 * 4) = iVar1;
        *(uint *)(*in_RDI + (ulong)local_24 * 4) =
             (1 << ((byte)*(undefined4 *)(in_RDI[1] + (ulong)local_24 * 4) & 0x1f)) - 1U &
             *(uint *)(*in_RDI + (ulong)local_24 * 4);
      }
    }
  }
  lodepng_free((void *)0x3570e9);
  lodepng_free((void *)0x3570f3);
  if (local_1c == 0) {
    local_1c = HuffmanTree_makeTable(in_stack_00000058);
  }
  return local_1c;
}

Assistant:

static unsigned HuffmanTree_makeFromLengths2(HuffmanTree* tree) {
  unsigned* blcount;
  unsigned* nextcode;
  unsigned error = 0;
  unsigned bits, n;

  tree->codes = (unsigned*)lodepng_malloc(tree->numcodes * sizeof(unsigned));
  blcount = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  nextcode = (unsigned*)lodepng_malloc((tree->maxbitlen + 1) * sizeof(unsigned));
  if(!tree->codes || !blcount || !nextcode) error = 83; /*alloc fail*/

  if(!error) {
    for(n = 0; n != tree->maxbitlen + 1; n++) blcount[n] = nextcode[n] = 0;
    /*step 1: count number of instances of each code length*/
    for(bits = 0; bits != tree->numcodes; ++bits) ++blcount[tree->lengths[bits]];
    /*step 2: generate the nextcode values*/
    for(bits = 1; bits <= tree->maxbitlen; ++bits) {
      nextcode[bits] = (nextcode[bits - 1] + blcount[bits - 1]) << 1u;
    }
    /*step 3: generate all the codes*/
    for(n = 0; n != tree->numcodes; ++n) {
      if(tree->lengths[n] != 0) {
        tree->codes[n] = nextcode[tree->lengths[n]]++;
        /*remove superfluous bits from the code*/
        tree->codes[n] &= ((1u << tree->lengths[n]) - 1u);
      }
    }
  }

  lodepng_free(blcount);
  lodepng_free(nextcode);

  if(!error) error = HuffmanTree_makeTable(tree);
  return error;
}